

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::setCurrentIndex(PickerPrivate *this,QPoint *pos)

{
  Picker *pPVar1;
  bool bVar2;
  Int IVar3;
  int _t1;
  bool bVar4;
  QString local_50;
  QFlags<Qt::ItemFlag> local_38;
  Int local_34;
  undefined1 local_30 [8];
  QModelIndex index;
  QPoint *pos_local;
  PickerPrivate *this_local;
  
  index.m = (QAbstractItemModel *)pos;
  indexForPos((QModelIndex *)local_30,this,pos);
  bVar2 = QModelIndex::isValid((QModelIndex *)local_30);
  bVar4 = false;
  if (bVar2) {
    local_38.i = (Int)QModelIndex::flags((QModelIndex *)local_30);
    local_34 = (Int)QFlags<Qt::ItemFlag>::operator&(&local_38,ItemIsEnabled);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_34);
    bVar4 = IVar3 != 0;
  }
  if (bVar4) {
    setCurrentIndex(this,(QModelIndex *)local_30);
    pPVar1 = this->q;
    itemText(&local_50,this,(QModelIndex *)local_30);
    Picker::activated(pPVar1,&local_50);
    QString::~QString(&local_50);
    pPVar1 = this->q;
    _t1 = QModelIndex::row((QModelIndex *)local_30);
    Picker::activated(pPVar1,_t1);
  }
  return;
}

Assistant:

void
PickerPrivate::setCurrentIndex( const QPoint & pos )
{
	const QModelIndex index = indexForPos( pos );

	if( index.isValid() && ( index.flags() & Qt::ItemIsEnabled ) )
	{
		setCurrentIndex( index );
		emit q->activated( itemText( index ) );
		emit q->activated( index.row() );
	}
}